

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double benchmark_insert<eumorphic::collection<stack_container,A,B,C,D,CA,CB>>(size_t num_elems)

{
  ulong uVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  time_point start;
  collection<stack_container,_A,_B,_C,_D,_CA,_CB> container;
  
  boost::hana::
  tuple<eumorphic::bounded_array<A,250ul>,eumorphic::bounded_array<B,250ul>,eumorphic::bounded_array<C,250ul>,eumorphic::bounded_array<D,250ul>,eumorphic::bounded_array<CA,250ul>,eumorphic::bounded_array<CB,250ul>>
  ::tuple<,void>((tuple<eumorphic::bounded_array<A,250ul>,eumorphic::bounded_array<B,250ul>,eumorphic::bounded_array<C,250ul>,eumorphic::bounded_array<D,250ul>,eumorphic::bounded_array<CA,250ul>,eumorphic::bounded_array<CB,250ul>>
                  *)&container);
  start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  uVar1 = num_elems / 5;
  puVar3 = (undefined8 *)
           ((long)&container.data_.storage_.
                   super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
                   .
                   super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>
                   .data_.super_array<D,_250UL> +
           container.data_.storage_.
           super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
           .super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>.
           data_.size_ * 0x38 + 0x10);
  while( true ) {
    bVar5 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar5) break;
    lVar4 = container.data_.storage_.
            super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
            .super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.
            data_.size_ * 0x10;
    container.data_.storage_.
    super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
    .super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.data_.
    size_ = container.data_.storage_.
            super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
            .super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.
            data_.size_ + 1;
    *(undefined8 *)
     ((long)&container.data_.storage_.
             super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
             .super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.
             data_.super_array<CA,_250UL> + lVar4 + 8) = 0x3ff0000000000000;
    lVar4 = container.data_.storage_.
            super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
            .super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.
            data_.size_ * 0x10;
    container.data_.storage_.
    super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
    .super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.data_.size_
         = container.data_.storage_.
           super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
           .super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.
           data_.size_ + 1;
    *(undefined8 *)
     ((long)&container.data_.storage_.
             super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
             .super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.
             data_.super_array<B,_250UL> + lVar4 + 8) = 0x3ff0000000000000;
    lVar4 = container.data_.storage_.
            super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
            .super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>.
            data_.size_ * 0x10;
    container.data_.storage_.
    super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
    .super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>.data_.size_
         = container.data_.storage_.
           super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
           .super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>.
           data_.size_ + 1;
    *(undefined8 *)
     ((long)&container.data_.storage_.
             super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
             .super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>.
             data_.super_array<A,_250UL> + lVar4 + 8) = 0x3ff0000000000000;
    lVar4 = container.data_.storage_.
            super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
            .super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.
            data_.size_ * 0x10;
    container.data_.storage_.
    super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
    .super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.data_.size_
         = container.data_.storage_.
           super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
           .super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.
           data_.size_ + 1;
    *(undefined8 *)
     ((long)&container.data_.storage_.
             super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
             .super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.
             data_.super_array<C,_250UL> + lVar4 + 8) = 0x3ff0000000000000;
    puVar3[-1] = 0x3ff0000000000000;
    puVar3[4] = 0;
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3 = puVar3 + 7;
    container.data_.storage_.
    super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
    .super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>.data_.size_
         = container.data_.storage_.
           super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
           .super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>.
           data_.size_ + 1;
  }
  dVar6 = toc(&start);
  sVar2 = eumorphic::collection<stack_container,_A,_B,_C,_D,_CA,_CB>::size(&container);
  do_not_optimize_out<stack_container,_A,_B,_C,_D,_CA,_CB>(&container);
  auVar7._8_4_ = (int)(sVar2 >> 0x20);
  auVar7._0_8_ = sVar2;
  auVar7._12_4_ = 0x45300000;
  return dVar6 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
}

Assistant:

double benchmark_insert( std::size_t num_elems)
{
	Cont container;

	//std::cout << "i";
	
	auto start = tic();
	{
                        for (size_t i = 0; i != num_elems/5; i++)
			{
				insert_default_value_of<CA>(container);
				insert_default_value_of<B>(container);
				insert_default_value_of<A>(container);
				insert_default_value_of<C>(container);
				insert_default_value_of<D>(container);
			}
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}